

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderImageSizeTests.cpp
# Opt level: O0

long __thiscall
gl4cts::(anonymous_namespace)::ImageSizeMachine::Run<tcu::Vector<int,4>>
          (ImageSizeMachine *this,int stage,bool ms_and_1d,ivec4 *expected_result,bool subroutine)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  bool bVar8;
  GLuint GVar9;
  uint *puVar10;
  int *piVar11;
  undefined1 *pixels;
  undefined4 uVar12;
  Vector<int,_4> *local_308;
  Vector<int,_4> *local_2f0;
  int local_26c;
  undefined1 local_268 [4];
  int i_2;
  ivec4 data_1 [7];
  Vector<int,_4> local_1ec;
  int local_1dc;
  undefined1 local_1d8 [4];
  int i_1;
  ivec4 data [7];
  GLchar *pGStack_160;
  int i;
  char *glsl_fs;
  string fs;
  char *glsl_vs_4;
  char *glsl_cs;
  string cs;
  char *glsl_gs;
  string gs;
  char *glsl_vs_3;
  char *glsl_tes_1;
  string tes;
  char *glsl_vs_2;
  char *glsl_tcs;
  string tcs;
  char *glsl_tes;
  char *glsl_vs_1;
  GLchar *local_60;
  char *glsl_vs;
  string vs;
  bool subroutine_local;
  ivec4 *expected_result_local;
  bool ms_and_1d_local;
  int stage_local;
  ImageSizeMachine *this_local;
  
  vs.field_2._M_local_buf[0xf] = subroutine;
  if (stage == 0) {
    GenShader<tcu::Vector<int,4>>((string *)&glsl_vs,this,0,ms_and_1d,subroutine);
    local_60 = (GLchar *)std::__cxx11::string::c_str();
    GVar9 = glu::CallLogWrapper::glCreateShaderProgramv
                      ((CallLogWrapper *)(this + 8),0x8b31,1,&local_60);
    *(GLuint *)(this + 0x2c) = GVar9;
    glu::CallLogWrapper::glUseProgramStages
              ((CallLogWrapper *)(this + 8),*(GLuint *)(this + 0x28),1,*(GLuint *)(this + 0x2c));
    std::__cxx11::string::~string((string *)&glsl_vs);
  }
  else if (stage == 1) {
    glsl_tes = "#version 430 core\nvoid main() { gl_Position = vec4(0.0, 0.0, 0.0, 1.0);}";
    tcs.field_2._8_8_ = anon_var_dwarf_2d71a0;
    GenShader<tcu::Vector<int,4>>((string *)&glsl_tcs,this,1,ms_and_1d,subroutine);
    glsl_vs_2 = (char *)std::__cxx11::string::c_str();
    GVar9 = glu::CallLogWrapper::glCreateShaderProgramv
                      ((CallLogWrapper *)(this + 8),0x8b31,1,&glsl_tes);
    *(GLuint *)(this + 0x2c) = GVar9;
    GVar9 = glu::CallLogWrapper::glCreateShaderProgramv
                      ((CallLogWrapper *)(this + 8),0x8e88,1,&glsl_vs_2);
    *(GLuint *)(this + 0x30) = GVar9;
    GVar9 = glu::CallLogWrapper::glCreateShaderProgramv
                      ((CallLogWrapper *)(this + 8),0x8e87,1,(GLchar **)((long)&tcs.field_2 + 8));
    *(GLuint *)(this + 0x34) = GVar9;
    glu::CallLogWrapper::glUseProgramStages
              ((CallLogWrapper *)(this + 8),*(GLuint *)(this + 0x28),1,*(GLuint *)(this + 0x2c));
    glu::CallLogWrapper::glUseProgramStages
              ((CallLogWrapper *)(this + 8),*(GLuint *)(this + 0x28),8,*(GLuint *)(this + 0x30));
    glu::CallLogWrapper::glUseProgramStages
              ((CallLogWrapper *)(this + 8),*(GLuint *)(this + 0x28),0x10,*(GLuint *)(this + 0x34));
    std::__cxx11::string::~string((string *)&glsl_tcs);
  }
  else if (stage == 2) {
    tes.field_2._8_8_ = anon_var_dwarf_2d7189;
    GenShader<tcu::Vector<int,4>>((string *)&glsl_tes_1,this,2,ms_and_1d,subroutine);
    glsl_vs_3 = (char *)std::__cxx11::string::c_str();
    GVar9 = glu::CallLogWrapper::glCreateShaderProgramv
                      ((CallLogWrapper *)(this + 8),0x8b31,1,(GLchar **)((long)&tes.field_2 + 8));
    *(GLuint *)(this + 0x2c) = GVar9;
    GVar9 = glu::CallLogWrapper::glCreateShaderProgramv
                      ((CallLogWrapper *)(this + 8),0x8e87,1,&glsl_vs_3);
    *(GLuint *)(this + 0x30) = GVar9;
    glu::CallLogWrapper::glUseProgramStages
              ((CallLogWrapper *)(this + 8),*(GLuint *)(this + 0x28),1,*(GLuint *)(this + 0x2c));
    glu::CallLogWrapper::glUseProgramStages
              ((CallLogWrapper *)(this + 8),*(GLuint *)(this + 0x28),0x10,*(GLuint *)(this + 0x30));
    std::__cxx11::string::~string((string *)&glsl_tes_1);
  }
  else if (stage == 3) {
    gs.field_2._8_8_ = anon_var_dwarf_2d7189;
    GenShader<tcu::Vector<int,4>>((string *)&glsl_gs,this,3,ms_and_1d,subroutine);
    cs.field_2._8_8_ = std::__cxx11::string::c_str();
    GVar9 = glu::CallLogWrapper::glCreateShaderProgramv
                      ((CallLogWrapper *)(this + 8),0x8b31,1,(GLchar **)((long)&gs.field_2 + 8));
    *(GLuint *)(this + 0x2c) = GVar9;
    GVar9 = glu::CallLogWrapper::glCreateShaderProgramv
                      ((CallLogWrapper *)(this + 8),0x8dd9,1,(GLchar **)((long)&cs.field_2 + 8));
    *(GLuint *)(this + 0x30) = GVar9;
    glu::CallLogWrapper::glUseProgramStages
              ((CallLogWrapper *)(this + 8),*(GLuint *)(this + 0x28),1,*(GLuint *)(this + 0x2c));
    glu::CallLogWrapper::glUseProgramStages
              ((CallLogWrapper *)(this + 8),*(GLuint *)(this + 0x28),4,*(GLuint *)(this + 0x30));
    std::__cxx11::string::~string((string *)&glsl_gs);
  }
  else if (stage == 4) {
    GenShader<tcu::Vector<int,4>>((string *)&glsl_cs,this,4,ms_and_1d,subroutine);
    glsl_vs_4 = (char *)std::__cxx11::string::c_str();
    GVar9 = glu::CallLogWrapper::glCreateShaderProgramv
                      ((CallLogWrapper *)(this + 8),0x91b9,1,&glsl_vs_4);
    *(GLuint *)(this + 0x2c) = GVar9;
    glu::CallLogWrapper::glUseProgramStages
              ((CallLogWrapper *)(this + 8),*(GLuint *)(this + 0x28),0x20,*(GLuint *)(this + 0x2c));
    std::__cxx11::string::~string((string *)&glsl_cs);
  }
  else if (stage == 5) {
    fs.field_2._8_8_ = anon_var_dwarf_2d7189;
    GenShader<tcu::Vector<int,4>>((string *)&glsl_fs,this,5,ms_and_1d,subroutine);
    pGStack_160 = (GLchar *)std::__cxx11::string::c_str();
    GVar9 = glu::CallLogWrapper::glCreateShaderProgramv
                      ((CallLogWrapper *)(this + 8),0x8b31,1,(GLchar **)((long)&fs.field_2 + 8));
    *(GLuint *)(this + 0x2c) = GVar9;
    GVar9 = glu::CallLogWrapper::glCreateShaderProgramv
                      ((CallLogWrapper *)(this + 8),0x8b30,1,&stack0xfffffffffffffea0);
    *(GLuint *)(this + 0x30) = GVar9;
    glu::CallLogWrapper::glUseProgramStages
              ((CallLogWrapper *)(this + 8),*(GLuint *)(this + 0x28),1,*(GLuint *)(this + 0x2c));
    glu::CallLogWrapper::glUseProgramStages
              ((CallLogWrapper *)(this + 8),*(GLuint *)(this + 0x28),2,*(GLuint *)(this + 0x30));
    std::__cxx11::string::~string((string *)&glsl_fs);
  }
  for (data[6].m_data[3] = 0; data[6].m_data[3] < 3; data[6].m_data[3] = data[6].m_data[3] + 1) {
    bVar8 = gl4cts::anon_unknown_0::ImageSizeMachine::CheckProgram
                      ((ImageSizeMachine *)this,
                       *(GLuint *)(this + (long)data[6].m_data[3] * 4 + 0x2c));
    if (!bVar8) {
      this_local = (ImageSizeMachine *)&DAT_ffffffffffffffff;
      return (long)this_local;
    }
  }
  glu::CallLogWrapper::glBindTexture((CallLogWrapper *)(this + 8),0xde1,*(GLuint *)(this + 0x3c));
  glu::CallLogWrapper::glTexParameteri((CallLogWrapper *)(this + 8),0xde1,0x2801,0x2600);
  glu::CallLogWrapper::glTexParameteri((CallLogWrapper *)(this + 8),0xde1,0x2800,0x2600);
  local_2f0 = (Vector<int,_4> *)local_1d8;
  do {
    tcu::Vector<int,_4>::Vector(local_2f0);
    local_2f0 = local_2f0 + 1;
  } while (local_2f0 != (Vector<int,_4> *)(data[6].m_data + 2));
  for (local_1dc = 0; local_1dc < 7; local_1dc = local_1dc + 1) {
    tcu::Vector<int,_4>::Vector(&local_1ec,100000);
    *(undefined8 *)(local_1d8 + (long)local_1dc * 0x10) = local_1ec.m_data._0_8_;
    *(undefined8 *)data[local_1dc].m_data = local_1ec.m_data._8_8_;
  }
  pixels = local_1d8;
  glu::CallLogWrapper::glTexImage2D
            ((CallLogWrapper *)(this + 8),0xde1,0,0x8d82,1,7,0,0x8d99,0x1404,pixels);
  glu::CallLogWrapper::glBindTexture((CallLogWrapper *)(this + 8),0xde1,0);
  glu::CallLogWrapper::glBindImageTexture
            ((CallLogWrapper *)(this + 8),0,*(GLuint *)(this + 0x3c),0,'\0',0,0x88b9,0x8d82);
  glu::CallLogWrapper::glBindProgramPipeline((CallLogWrapper *)(this + 8),*(GLuint *)(this + 0x28));
  glu::CallLogWrapper::glBindVertexArray((CallLogWrapper *)(this + 8),*(GLuint *)(this + 0x38));
  if (stage != 5) {
    glu::CallLogWrapper::glEnable((CallLogWrapper *)(this + 8),0x8c89);
  }
  if ((stage == 1) || (stage == 2)) {
    glu::CallLogWrapper::glPatchParameteri((CallLogWrapper *)(this + 8),0x8e72,1);
    glu::CallLogWrapper::glDrawArrays((CallLogWrapper *)(this + 8),0xe,0,1);
    glu::CallLogWrapper::glPatchParameteri((CallLogWrapper *)(this + 8),0x8e72,3);
  }
  else if (stage == 4) {
    glu::CallLogWrapper::glDispatchCompute((CallLogWrapper *)(this + 8),1,1,1);
  }
  else {
    glu::CallLogWrapper::glDrawArrays((CallLogWrapper *)(this + 8),0,0,1);
  }
  glu::CallLogWrapper::glDisable((CallLogWrapper *)(this + 8),0x8c89);
  glu::CallLogWrapper::glBindTexture((CallLogWrapper *)(this + 8),0xde1,*(GLuint *)(this + 0x3c));
  glu::CallLogWrapper::glMemoryBarrier((CallLogWrapper *)(this + 8),0x100);
  local_308 = (Vector<int,_4> *)local_268;
  do {
    tcu::Vector<int,_4>::Vector(local_308);
    local_308 = local_308 + 1;
  } while (local_308 != (Vector<int,_4> *)(data_1[6].m_data + 2));
  glu::CallLogWrapper::glGetTexImage((CallLogWrapper *)(this + 8),0xde1,0,0x8d99,0x1404,local_268);
  local_26c = 0;
  while( true ) {
    if (6 < local_26c) {
      return 0;
    }
    bVar8 = tcu::Vector<int,_4>::operator!=
                      ((Vector<int,_4> *)(local_268 + (long)local_26c * 0x10),
                       expected_result + local_26c);
    uVar12 = (undefined4)((ulong)pixels >> 0x20);
    if (bVar8) break;
    local_26c = local_26c + 1;
  }
  puVar10 = (uint *)tcu::Vector<int,_4>::operator[]
                              ((Vector<int,_4> *)(local_268 + (long)local_26c * 0x10),0);
  uVar1 = *puVar10;
  puVar10 = (uint *)tcu::Vector<int,_4>::operator[]
                              ((Vector<int,_4> *)(local_268 + (long)local_26c * 0x10),1);
  uVar2 = *puVar10;
  puVar10 = (uint *)tcu::Vector<int,_4>::operator[]
                              ((Vector<int,_4> *)(local_268 + (long)local_26c * 0x10),2);
  uVar3 = *puVar10;
  puVar10 = (uint *)tcu::Vector<int,_4>::operator[]
                              ((Vector<int,_4> *)(local_268 + (long)local_26c * 0x10),3);
  uVar4 = *puVar10;
  puVar10 = (uint *)tcu::Vector<int,_4>::operator[](expected_result + local_26c,0);
  uVar5 = *puVar10;
  piVar11 = tcu::Vector<int,_4>::operator[](expected_result + local_26c,1);
  iVar6 = *piVar11;
  piVar11 = tcu::Vector<int,_4>::operator[](expected_result + local_26c,2);
  iVar7 = *piVar11;
  piVar11 = tcu::Vector<int,_4>::operator[](expected_result + local_26c,3);
  gl4cts::anon_unknown_0::Output
            ("Returned value is: (%d %d %d %d). Expected value is: (%d %d %d %d). Image unit is: %d.\n"
             ,(ulong)uVar1,(ulong)uVar2,(ulong)uVar3,(ulong)uVar4,(ulong)uVar5,iVar6,iVar7,*piVar11,
             CONCAT44(uVar12,local_26c + 1));
  this_local = (ImageSizeMachine *)&DAT_ffffffffffffffff;
  return (long)this_local;
}

Assistant:

long Run(int stage, bool ms_and_1d, ivec4 expected_result[7], bool subroutine = false)
	{
		if (stage == 0)
		{ // VS
			std::string		  vs	  = GenShader<T>(stage, ms_and_1d, subroutine);
			const char* const glsl_vs = vs.c_str();
			m_program[0]			  = glCreateShaderProgramv(GL_VERTEX_SHADER, 1, &glsl_vs);
			glUseProgramStages(m_pipeline, GL_VERTEX_SHADER_BIT, m_program[0]);
		}
		else if (stage == 1)
		{ // TCS
			const char* const glsl_vs = "#version 430 core" NL "void main() { gl_Position = vec4(0.0, 0.0, 0.0, 1.0);}";
			const char* const glsl_tes = "#version 430 core" NL "layout(quads, point_mode) in;" NL "void main() {}";
			std::string		  tcs	  = GenShader<T>(stage, ms_and_1d, subroutine);
			const char* const glsl_tcs = tcs.c_str();
			m_program[0]			   = glCreateShaderProgramv(GL_VERTEX_SHADER, 1, &glsl_vs);
			m_program[1]			   = glCreateShaderProgramv(GL_TESS_CONTROL_SHADER, 1, &glsl_tcs);
			m_program[2]			   = glCreateShaderProgramv(GL_TESS_EVALUATION_SHADER, 1, &glsl_tes);
			glUseProgramStages(m_pipeline, GL_VERTEX_SHADER_BIT, m_program[0]);
			glUseProgramStages(m_pipeline, GL_TESS_CONTROL_SHADER_BIT, m_program[1]);
			glUseProgramStages(m_pipeline, GL_TESS_EVALUATION_SHADER_BIT, m_program[2]);
		}
		else if (stage == 2)
		{ // TES
			const char* const glsl_vs = "#version 430 core" NL "void main() { gl_Position = vec4(0.0, 0.0, 0.0, 1.0);}";
			std::string		  tes	 = GenShader<T>(stage, ms_and_1d, subroutine);
			const char* const glsl_tes = tes.c_str();
			m_program[0]			   = glCreateShaderProgramv(GL_VERTEX_SHADER, 1, &glsl_vs);
			m_program[1]			   = glCreateShaderProgramv(GL_TESS_EVALUATION_SHADER, 1, &glsl_tes);
			glUseProgramStages(m_pipeline, GL_VERTEX_SHADER_BIT, m_program[0]);
			glUseProgramStages(m_pipeline, GL_TESS_EVALUATION_SHADER_BIT, m_program[1]);
		}
		else if (stage == 3)
		{ // GS
			const char* const glsl_vs = "#version 430 core" NL "void main() { gl_Position = vec4(0.0, 0.0, 0.0, 1.0);}";
			std::string		  gs	  = GenShader<T>(stage, ms_and_1d, subroutine);
			const char* const glsl_gs = gs.c_str();
			m_program[0]			  = glCreateShaderProgramv(GL_VERTEX_SHADER, 1, &glsl_vs);
			m_program[1]			  = glCreateShaderProgramv(GL_GEOMETRY_SHADER, 1, &glsl_gs);
			glUseProgramStages(m_pipeline, GL_VERTEX_SHADER_BIT, m_program[0]);
			glUseProgramStages(m_pipeline, GL_GEOMETRY_SHADER_BIT, m_program[1]);
		}
		else if (stage == 4)
		{ // CS
			std::string		  cs	  = GenShader<T>(stage, ms_and_1d, subroutine);
			const char* const glsl_cs = cs.c_str();
			m_program[0]			  = glCreateShaderProgramv(GL_COMPUTE_SHADER, 1, &glsl_cs);
			glUseProgramStages(m_pipeline, GL_COMPUTE_SHADER_BIT, m_program[0]);
		}
		else if (stage == 5)
		{ // FS
			const char* const glsl_vs = "#version 430 core" NL "void main() { gl_Position = vec4(0.0, 0.0, 0.0, 1.0);}";
			std::string		  fs	  = GenShader<T>(stage, ms_and_1d, subroutine);
			const char* const glsl_fs = fs.c_str();
			m_program[0]			  = glCreateShaderProgramv(GL_VERTEX_SHADER, 1, &glsl_vs);
			m_program[1]			  = glCreateShaderProgramv(GL_FRAGMENT_SHADER, 1, &glsl_fs);
			glUseProgramStages(m_pipeline, GL_VERTEX_SHADER_BIT, m_program[0]);
			glUseProgramStages(m_pipeline, GL_FRAGMENT_SHADER_BIT, m_program[1]);
		}
		for (int i = 0; i < 3; ++i)
		{
			if (!CheckProgram(m_program[i]))
				return ERROR;
		}

		glBindTexture(GL_TEXTURE_2D, m_texture);
		glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_NEAREST);
		glTexParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
		{
			ivec4 data[7];
			for (int i  = 0; i < 7; ++i)
				data[i] = ivec4(100000);
			glTexImage2D(GL_TEXTURE_2D, 0, GL_RGBA32I, 1, 7, 0, GL_RGBA_INTEGER, GL_INT, &data[0]);
		}
		glBindTexture(GL_TEXTURE_2D, 0);

		glBindImageTexture(0, m_texture, 0, GL_FALSE, 0, GL_WRITE_ONLY, GL_RGBA32I);
		glBindProgramPipeline(m_pipeline);
		glBindVertexArray(m_vertex_array);
		if (stage != 5)
		{
			glEnable(GL_RASTERIZER_DISCARD);
		}
		if (stage == 1 || stage == 2)
		{ // TCS or TES
			glPatchParameteri(GL_PATCH_VERTICES, 1);
			glDrawArrays(GL_PATCHES, 0, 1);
			glPatchParameteri(GL_PATCH_VERTICES, 3);
		}
		else if (stage == 4)
		{ // CS
			glDispatchCompute(1, 1, 1);
		}
		else
		{
			glDrawArrays(GL_POINTS, 0, 1);
		}
		glDisable(GL_RASTERIZER_DISCARD);

		glBindTexture(GL_TEXTURE_2D, m_texture);
		glMemoryBarrier(GL_TEXTURE_UPDATE_BARRIER_BIT);
		{
			ivec4 data[7];
			glGetTexImage(GL_TEXTURE_2D, 0, GL_RGBA_INTEGER, GL_INT, &data[0]);
			for (int i = 0; i < 7; ++i)
			{
				if (data[i] != expected_result[i])
				{
					Output("Returned value is: (%d %d %d %d). Expected value is: (%d %d %d %d). Image unit is: %d.\n",
						   data[i][0], data[i][1], data[i][2], data[i][3], expected_result[i][0], expected_result[i][1],
						   expected_result[i][2], expected_result[i][3], i + 1);
					return ERROR;
				}
			}
		}
		return NO_ERROR;
	}